

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cSampleShadingTests.cpp
# Opt level: O2

void __thiscall
glcts::SampleShadingRenderFormatTests::SampleShadingRenderFormatTests
          (SampleShadingRenderFormatTests *this,Context *context,GLSLVersion glslVersion,
          GLenum internalFormat,char *format,TextureFormat *texFormat,char *sampler,char *outType,
          GLfloat min,GLfloat max,char *extension)

{
  allocator<char> local_33;
  allocator<char> local_32;
  allocator<char> local_31;
  GLfloat local_30;
  GLfloat local_2c;
  
  local_30 = min;
  local_2c = max;
  deqp::TestCaseGroup::TestCaseGroup
            (&this->super_TestCaseGroup,context,format,fixed_sample_locations_values + 1);
  (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SampleShadingRenderFormatTests_01de4d68;
  this->m_glslVersion = glslVersion;
  this->m_internalFormat = internalFormat;
  this->m_texFormat = *texFormat;
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->m_sampler,sampler,&local_31);
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->m_outType,outType,&local_32);
  this->m_min = local_30;
  this->m_max = local_2c;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->m_extension,extension,&local_33);
  return;
}

Assistant:

SampleShadingRenderFormatTests::SampleShadingRenderFormatTests(Context& context, glu::GLSLVersion glslVersion,
															   GLenum internalFormat, const char* format,
															   tcu::TextureFormat const& texFormat, const char* sampler,
															   const char* outType, GLfloat min, GLfloat max,
															   const char* extension)
	: TestCaseGroup(context, format, "")
	, m_glslVersion(glslVersion)
	, m_internalFormat(internalFormat)
	, m_texFormat(texFormat)
	, m_sampler(sampler)
	, m_outType(outType)
	, m_min(min)
	, m_max(max)
	, m_extension(extension)
{
}